

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

DatabaseInterface * __thiscall
Fossilize::ConcurrentDatabase::get_sub_database(ConcurrentDatabase *this,uint index)

{
  pointer puVar1;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *puVar2;
  
  if (this->mode != ReadOnly) {
    return (DatabaseInterface *)0x0;
  }
  if (index == 0) {
    puVar2 = &this->readonly_interface;
  }
  else {
    puVar1 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->extra_readonly).
                      super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) < (ulong)index
       ) {
      return (DatabaseInterface *)0x0;
    }
    puVar2 = puVar1 + (index - 1);
  }
  return (puVar2->_M_t).
         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
         ._M_t.
         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
}

Assistant:

DatabaseInterface *get_sub_database(unsigned index) override
	{
		if (mode != DatabaseMode::ReadOnly)
			return nullptr;

		if (index == 0)
			return readonly_interface.get();
		else if (index <= extra_readonly.size())
			return extra_readonly[index - 1].get();
		else
			return nullptr;
	}